

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

String * __thiscall
Json::OurReader::getFormattedErrorMessages_abi_cxx11_
          (String *__return_storage_ptr__,OurReader *this)

{
  _Elt_pointer pEVar1;
  _Elt_pointer pEVar2;
  _Map_pointer local_a8;
  _Elt_pointer local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  String local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar2 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_a0 = (this->errors_).
             super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
  local_a8 = (this->errors_).
             super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pEVar1 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  while (pEVar2 != pEVar1) {
    getLocationLineAndColumn_abi_cxx11_(&local_50,this,(pEVar2->token_).start_);
    std::operator+(&local_90,"* ",&local_50);
    std::operator+(&local_70,&local_90,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::operator+(&local_90,"  ",&pEVar2->message_);
    std::operator+(&local_70,&local_90,"\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    if (pEVar2->extra_ != (Location)0x0) {
      getLocationLineAndColumn_abi_cxx11_(&local_50,this,pEVar2->extra_);
      std::operator+(&local_90,"See ",&local_50);
      std::operator+(&local_70,&local_90," for detail.\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    pEVar2 = pEVar2 + 1;
    if (pEVar2 == local_a0) {
      pEVar2 = local_a8[1];
      local_a8 = local_a8 + 1;
      local_a0 = pEVar2 + 8;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String OurReader::getFormattedErrorMessages() const {
  String formattedMessage;
  for (const auto& error : errors_) {
    formattedMessage +=
        "* " + getLocationLineAndColumn(error.token_.start_) + "\n";
    formattedMessage += "  " + error.message_ + "\n";
    if (error.extra_)
      formattedMessage +=
          "See " + getLocationLineAndColumn(error.extra_) + " for detail.\n";
  }
  return formattedMessage;
}